

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_enum_udev.c
# Opt level: O0

int igsc_device_iterator_create(igsc_device_iterator **iter)

{
  long lVar1;
  int iVar2;
  igsc_log_func_t p_Var3;
  char *pcVar4;
  igsc_device_iterator *__ptr;
  udev *puVar5;
  udev_enumerate *puVar6;
  long in_FS_OFFSET;
  igsc_log_func_t igsc_log_func_5;
  igsc_log_func_t igsc_log_func_4;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  int ret;
  igsc_device_iterator *it;
  igsc_device_iterator **iter_local;
  char local_618 [8];
  char __time_buf_11 [128];
  char __time_buf_10 [128];
  char __time_buf_9 [128];
  char __time_buf_8 [128];
  char __time_buf_7 [128];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (iter == (igsc_device_iterator **)0x0) {
    p_Var3 = igsc_get_log_callback_func();
    if (p_Var3 == (igsc_log_func_t)0x0) {
      pcVar4 = gsc_time(__time_buf_1 + 0x78,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
             ,"igsc_device_iterator_create",0x22);
    }
    else {
      p_Var3 = igsc_get_log_callback_func();
      pcVar4 = gsc_time(__time_buf_2 + 0x78,0x80);
      (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                ,"igsc_device_iterator_create",0x22);
    }
    iter_local._4_4_ = 3;
  }
  else {
    __ptr = (igsc_device_iterator *)calloc(1,0x18);
    if (__ptr == (igsc_device_iterator *)0x0) {
      p_Var3 = igsc_get_log_callback_func();
      if (p_Var3 == (igsc_log_func_t)0x0) {
        pcVar4 = gsc_time(__time_buf_3 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
               ,"igsc_device_iterator_create",0x29);
      }
      else {
        p_Var3 = igsc_get_log_callback_func();
        pcVar4 = gsc_time(__time_buf_4 + 0x78,0x80);
        (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Can\'t allocate iterator\n",pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                  ,"igsc_device_iterator_create",0x29);
      }
      iter_local._4_4_ = 2;
    }
    else {
      puVar5 = (udev *)udev_new();
      __ptr->udev = puVar5;
      if (__ptr->udev == (udev *)0x0) {
        p_Var3 = igsc_get_log_callback_func();
        if (p_Var3 == (igsc_log_func_t)0x0) {
          pcVar4 = gsc_time(__time_buf_5 + 0x78,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                 ,"igsc_device_iterator_create",0x30);
        }
        else {
          p_Var3 = igsc_get_log_callback_func();
          pcVar4 = gsc_time(__time_buf_6 + 0x78,0x80);
          (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                    ,"igsc_device_iterator_create",0x30);
        }
      }
      else {
        puVar6 = (udev_enumerate *)udev_enumerate_new(__ptr->udev);
        __ptr->enumerate = puVar6;
        if (__ptr->enumerate == (udev_enumerate *)0x0) {
          p_Var3 = igsc_get_log_callback_func();
          if (p_Var3 == (igsc_log_func_t)0x0) {
            pcVar4 = gsc_time(__time_buf_7 + 0x78,0x80);
            syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",pcVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                   ,"igsc_device_iterator_create",0x38);
          }
          else {
            p_Var3 = igsc_get_log_callback_func();
            pcVar4 = gsc_time(__time_buf_8 + 0x78,0x80);
            (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev_enumerate\n",
                      pcVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                      ,"igsc_device_iterator_create",0x38);
          }
        }
        else {
          iVar2 = udev_enumerate_add_match_sysattr(__ptr->enumerate,"kind","gscfi");
          if (iVar2 < 0) {
            p_Var3 = igsc_get_log_callback_func();
            if (p_Var3 == (igsc_log_func_t)0x0) {
              pcVar4 = gsc_time(__time_buf_9 + 0x78,0x80);
              syslog(3,"%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n",pcVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                     ,"igsc_device_iterator_create",0x3f,iVar2);
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(__time_buf_10 + 0x78,0x80);
              (*p_Var3)(IGSC_LOG_LEVEL_ERROR,
                        "%s: IGSC: (%s:%s():%d) Cannot match udev sysattr: %d\n",pcVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                        ,"igsc_device_iterator_create",0x3f,iVar2);
            }
          }
          else {
            iVar2 = udev_enumerate_scan_devices(__ptr->enumerate);
            if (-1 < iVar2) {
              __ptr->entry = (udev_list_entry *)0x0;
              *iter = __ptr;
              iter_local._4_4_ = 0;
              goto LAB_0012a45a;
            }
            p_Var3 = igsc_get_log_callback_func();
            if (p_Var3 == (igsc_log_func_t)0x0) {
              pcVar4 = gsc_time(__time_buf_11 + 0x78,0x80);
              syslog(3,"%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n",pcVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                     ,"igsc_device_iterator_create",0x46,iVar2);
            }
            else {
              p_Var3 = igsc_get_log_callback_func();
              pcVar4 = gsc_time(local_618,0x80);
              (*p_Var3)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot scan udev devices: %d\n"
                        ,pcVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/enum/igsc_enum_udev.c"
                        ,"igsc_device_iterator_create",0x46,iVar2);
            }
          }
          udev_enumerate_unref(__ptr->enumerate);
        }
        udev_unref(__ptr->udev);
      }
      free(__ptr);
      iter_local._4_4_ = 1;
    }
  }
LAB_0012a45a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iter_local._4_4_;
}

Assistant:

int igsc_device_iterator_create(struct igsc_device_iterator **iter)
{
    struct igsc_device_iterator *it = NULL;
    int ret;

    if (iter == NULL)
    {
        gsc_error("Bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    it = calloc(1, sizeof(*it));
    if (it == NULL)
    {
        gsc_error("Can't allocate iterator\n");
        return IGSC_ERROR_NOMEM;
    }

    it->udev = udev_new();
    if (it->udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_iter;
    }

    it->enumerate = udev_enumerate_new(it->udev);
    if (!it->enumerate)
    {
        gsc_error("Cannot create udev_enumerate\n");
        ret = IGSC_ERROR_INTERNAL;
        goto clean_udev;
    }

    if ((ret = udev_enumerate_add_match_sysattr(it->enumerate, "kind", "gscfi")) < 0)
    {
        gsc_error("Cannot match udev sysattr: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }

    if ((ret = udev_enumerate_scan_devices(it->enumerate)) < 0)
    {
        gsc_error("Cannot scan udev devices: %d\n", ret);
        ret = IGSC_ERROR_INTERNAL;
        goto clean_enum;
    }
    it->entry = NULL;
    *iter = it;

    return IGSC_SUCCESS;
clean_enum:
    udev_enumerate_unref(it->enumerate);
clean_udev:
    udev_unref(it->udev);
clean_iter:
    free(it);
    return ret;
}